

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPixelBufferObjectTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::anon_unknown_0::ReadPixelsTest::init
          (ReadPixelsTest *this,EVP_PKEY_CTX *ctx)

{
  char *__s;
  bool bVar1;
  bool bVar2;
  int iVar3;
  GLubyte *pGVar4;
  istream *piVar5;
  NotSupportedError *this_00;
  ostream *poVar6;
  ShaderProgram *this_01;
  RenderContext *renderCtx;
  TestError *this_02;
  string local_688;
  allocator<char> local_661;
  string local_660;
  ProgramSources local_640;
  stringstream local_570 [8];
  stringstream fragmentShaderSource;
  ostream local_560;
  char *local_3e8;
  char *vertexShaderSource;
  string local_3d8 [8];
  string outtype;
  string extension_1;
  string local_390 [32];
  istringstream local_370 [8];
  istringstream extensions_1;
  undefined1 local_1f0 [8];
  string extension;
  allocator<char> local_1b9;
  string local_1b8 [32];
  istringstream local_198 [8];
  istringstream extensions;
  bool supported;
  ReadPixelsTest *this_local;
  
  if (this->m_framebuffeType == FRAMEBUFFERTYPE_RENDERBUFFER) {
    bVar2 = false;
    if ((this->m_renderbufferFormat == 0x881a) || (this->m_renderbufferFormat == 0x822f)) {
      pGVar4 = glwGetString(0x1f03);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_1b8,(char *)pGVar4,&local_1b9);
      std::__cxx11::istringstream::istringstream(local_198,local_1b8,_S_in);
      std::__cxx11::string::~string(local_1b8);
      std::allocator<char>::~allocator(&local_1b9);
      std::__cxx11::string::string((string *)local_1f0);
      do {
        piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_198,(string *)local_1f0,' ');
        bVar1 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
        if (!bVar1) goto LAB_01ca7d95;
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_1f0,"GL_EXT_color_buffer_half_float");
        if (bVar1) {
          bVar2 = true;
          goto LAB_01ca7d95;
        }
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_1f0,"GL_EXT_color_buffer_float");
      } while (!bVar1);
      bVar2 = true;
LAB_01ca7d95:
      std::__cxx11::string::~string((string *)local_1f0);
      std::__cxx11::istringstream::~istringstream(local_198);
    }
    else if (((this->m_renderbufferFormat == 0x8814) || (this->m_renderbufferFormat == 0x8230)) ||
            (this->m_renderbufferFormat == 0x8c3a)) {
      pGVar4 = glwGetString(0x1f03);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_390,(char *)pGVar4,
                 (allocator<char> *)(extension_1.field_2._M_local_buf + 0xf));
      std::__cxx11::istringstream::istringstream(local_370,local_390,_S_in);
      std::__cxx11::string::~string(local_390);
      std::allocator<char>::~allocator((allocator<char> *)(extension_1.field_2._M_local_buf + 0xf));
      std::__cxx11::string::string((string *)(outtype.field_2._M_local_buf + 8));
      do {
        piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_370,(string *)(outtype.field_2._M_local_buf + 8),' ');
        bVar1 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
        if (!bVar1) goto LAB_01ca7f5f;
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&outtype.field_2 + 8),"GL_EXT_color_buffer_float");
      } while (!bVar1);
      bVar2 = true;
LAB_01ca7f5f:
      std::__cxx11::string::~string((string *)(outtype.field_2._M_local_buf + 8));
      std::__cxx11::istringstream::~istringstream(local_370);
    }
    else {
      bVar2 = true;
    }
    if (!bVar2) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"Renderbuffer format not supported","",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fPixelBufferObjectTests.cpp"
                 ,0xcb);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_3d8,"",(allocator<char> *)((long)&vertexShaderSource + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&vertexShaderSource + 7));
  if (this->m_framebuffeType == FRAMEBUFFERTYPE_NATIVE) {
    std::__cxx11::string::operator=(local_3d8,"vec4");
  }
  else if (this->m_framebuffeType == FRAMEBUFFERTYPE_RENDERBUFFER) {
    switch(this->m_texChannelClass) {
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
      std::__cxx11::string::operator=(local_3d8,"vec4");
      break;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      std::__cxx11::string::operator=(local_3d8,"ivec4");
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      std::__cxx11::string::operator=(local_3d8,"uvec4");
      break;
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      std::__cxx11::string::operator=(local_3d8,"vec4");
    }
  }
  local_3e8 = 
  "#version 300 es\nin mediump vec3 a_position;\nin mediump vec4 a_color;\nuniform mediump float u_colorScale;\nout mediump vec4 v_color;\nvoid main(void)\n{\n\tgl_Position = vec4(a_position, 1.0);\n\tv_color = u_colorScale * a_color;\n}"
  ;
  std::__cxx11::stringstream::stringstream(local_570);
  std::operator<<(&local_560,"#version 300 es\nin mediump vec4 v_color;\n");
  poVar6 = std::operator<<(&local_560,"layout (location = 0) out mediump ");
  poVar6 = std::operator<<(poVar6,local_3d8);
  poVar6 = std::operator<<(poVar6," o_color;\nvoid main(void)\n{\n\to_color = ");
  poVar6 = std::operator<<(poVar6,local_3d8);
  std::operator<<(poVar6,"(v_color);\n}");
  this_01 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  __s = local_3e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_660,__s,&local_661);
  std::__cxx11::stringstream::str();
  glu::makeVtxFragSources(&local_640,&local_660,&local_688);
  glu::ShaderProgram::ShaderProgram(this_01,renderCtx,&local_640);
  this->m_program = this_01;
  glu::ProgramSources::~ProgramSources(&local_640);
  std::__cxx11::string::~string((string *)&local_688);
  std::__cxx11::string::~string((string *)&local_660);
  std::allocator<char>::~allocator(&local_661);
  bVar2 = glu::ShaderProgram::isOk(this->m_program);
  if (bVar2) {
    std::__cxx11::stringstream::~stringstream(local_570);
    iVar3 = std::__cxx11::string::~string(local_3d8);
    return iVar3;
  }
  glu::operator<<(this->m_log,this->m_program);
  this_02 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_02,"Failed to compile shader",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fPixelBufferObjectTests.cpp"
             ,0x10c);
  __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void ReadPixelsTest::init (void)
{
	// Check extensions
	if (m_framebuffeType == TestSpec::FRAMEBUFFERTYPE_RENDERBUFFER)
	{
		bool supported = false;

		if (m_renderbufferFormat == GL_RGBA16F
			|| m_renderbufferFormat == GL_RG16F)
		{
			std::istringstream extensions(std::string((const char*)glGetString(GL_EXTENSIONS)));
			std::string extension;

			while (std::getline(extensions, extension, ' '))
			{
				if (extension=="GL_EXT_color_buffer_half_float")
				{
					supported = true;
					break;
				}
				if (extension=="GL_EXT_color_buffer_float")
				{
					supported = true;
					break;
				}
			}
		}
		else if (m_renderbufferFormat == GL_RGBA32F
				|| m_renderbufferFormat == GL_RG32F
				|| m_renderbufferFormat == GL_R11F_G11F_B10F)
		{
			std::istringstream extensions(std::string((const char*)glGetString(GL_EXTENSIONS)));
			std::string extension;

			while (std::getline(extensions, extension, ' '))
			{
				if (extension=="GL_EXT_color_buffer_float")
				{
					supported = true;
					break;
				}
			}
		}
		else
			supported = true;

		if (!supported)
			throw tcu::NotSupportedError("Renderbuffer format not supported", "", __FILE__, __LINE__);
	}

	std::string outtype = "";

	if (m_framebuffeType == TestSpec::FRAMEBUFFERTYPE_NATIVE)
		outtype = "vec4";
	else if (m_framebuffeType == TestSpec::FRAMEBUFFERTYPE_RENDERBUFFER)
	{
		switch (m_texChannelClass)
		{
			case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
				outtype = "vec4";
				break;

			case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
				outtype = "ivec4";
				break;

			case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
				outtype = "uvec4";
				break;

			case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
				outtype = "vec4";
				break;

			default:
				DE_ASSERT(false);
		}
	}
	else
		DE_ASSERT(false);


	const char* vertexShaderSource =
	"#version 300 es\n"
	"in mediump vec3 a_position;\n"
	"in mediump vec4 a_color;\n"
	"uniform mediump float u_colorScale;\n"
	"out mediump vec4 v_color;\n"
	"void main(void)\n"
	"{\n"
	"\tgl_Position = vec4(a_position, 1.0);\n"
	"\tv_color = u_colorScale * a_color;\n"
	"}";

	stringstream fragmentShaderSource;

	fragmentShaderSource <<
	"#version 300 es\n"
	"in mediump vec4 v_color;\n";


	fragmentShaderSource << "layout (location = 0) out mediump " << outtype << " o_color;\n"
	"void main(void)\n"
	"{\n"
	"\to_color = " << outtype << "(v_color);\n"
	"}";

	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::makeVtxFragSources(vertexShaderSource, fragmentShaderSource.str()));

	if (!m_program->isOk())
	{
		m_log << *m_program;
		TCU_FAIL("Failed to compile shader");
	}
}